

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O0

bool __thiscall
JsUtil::ReadOnlyList<Js::FunctionInfo_*,_Memory::Recycler,_DefaultComparer>::Contains
          (ReadOnlyList<Js::FunctionInfo_*,_Memory::Recycler,_DefaultComparer> *this,
          FunctionInfo **item)

{
  FunctionInfo *x;
  bool bVar1;
  WriteBarrierPtr<Js::FunctionInfo> **ppWVar2;
  FunctionInfo **ppFVar3;
  int local_24;
  int i;
  FunctionInfo **item_local;
  ReadOnlyList<Js::FunctionInfo_*,_Memory::Recycler,_DefaultComparer> *this_local;
  
  local_24 = 0;
  while( true ) {
    if (this->count <= local_24) {
      return false;
    }
    x = *item;
    ppWVar2 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                        ((WriteBarrierPtr *)&this->buffer);
    ppFVar3 = Memory::WriteBarrierPtr::operator_cast_to_FunctionInfo__
                        ((WriteBarrierPtr *)(*ppWVar2 + local_24));
    bVar1 = DefaultComparer<Js::FunctionInfo_*>::Equals(x,*ppFVar3);
    if (bVar1) break;
    local_24 = local_24 + 1;
  }
  return true;
}

Assistant:

bool Contains(const T& item) const
        {
            for (int i = 0; i < count; i++)
            {
                if (TComparerType::Equals(item, buffer[i]))
                {
                    return true;
                }
            }
            return false;
        }